

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O2

void __thiscall
duckdb::FirstVectorFunction<false,_false>::Update
          (FirstVectorFunction<false,_false> *this,Vector *inputs,AggregateInputData *input_data,
          idx_t param_3,Vector *state_vector,idx_t count)

{
  uint uVar1;
  Vector *pVVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 is_null;
  Vector *pVVar5;
  idx_t i;
  Vector *count_00;
  data_ptr_t pdVar6;
  bool bVar7;
  string_t value;
  SelectionVector sel;
  LogicalType local_21b0;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat idata;
  Vector sort_key;
  Vector sliced_input;
  sel_t assign_sel [2048];
  
  is_null = (undefined1)count;
  UnifiedVectorFormat::UnifiedVectorFormat(&idata);
  Vector::ToUnifiedFormat((Vector *)this,(idx_t)state_vector,&idata);
  UnifiedVectorFormat::UnifiedVectorFormat(&sdata);
  Vector::ToUnifiedFormat((Vector *)param_3,(idx_t)state_vector,&sdata);
  count_00 = (Vector *)0x0;
  for (pVVar5 = (Vector *)0x0; state_vector != pVVar5; pVVar5 = (Vector *)&pVVar5->field_0x1) {
    pVVar2 = pVVar5;
    if ((sdata.sel)->sel_vector != (sel_t *)0x0) {
      pVVar2 = (Vector *)(ulong)(sdata.sel)->sel_vector[(long)pVVar5];
    }
    if (*(char *)(*(long *)(sdata.data + (long)pVVar2 * 8) + 0x10) == '\0') {
      uVar1 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert((unsigned_long)pVVar5);
      assign_sel[(long)count_00] = uVar1;
      count_00 = (Vector *)&count_00->field_0x1;
    }
  }
  if (count_00 != (Vector *)0x0) {
    LogicalType::LogicalType(&local_21b0,BLOB);
    Vector::Vector(&sort_key,&local_21b0,0x800);
    LogicalType::~LogicalType(&local_21b0);
    if (count_00 == state_vector) {
      CreateSortKeyHelpers::CreateSortKey
                ((Vector *)this,(idx_t)state_vector,(OrderModifiers)0x302,&sort_key);
    }
    else {
      SelectionVector::SelectionVector(&sel,assign_sel);
      Vector::Vector(&sliced_input,(Vector *)this,&sel,(idx_t)count_00);
      CreateSortKeyHelpers::CreateSortKey
                (&sliced_input,(idx_t)count_00,(OrderModifiers)0x302,&sort_key);
      Vector::~Vector(&sliced_input);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    pdVar6 = sort_key.data + 8;
    for (pVVar5 = (Vector *)0x0; count_00 != pVVar5; pVVar5 = (Vector *)&pVVar5->field_0x1) {
      uVar3 = (ulong)assign_sel[(long)pVVar5];
      uVar4 = uVar3;
      if ((sdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(sdata.sel)->sel_vector[uVar3];
      }
      if ((*(FirstFunctionStringBase<false,false> **)(sdata.data + uVar4 * 8))[0x10] ==
          (FirstFunctionStringBase<false,false>)0x0) {
        if ((idata.sel)->sel_vector != (sel_t *)0x0) {
          uVar3 = (ulong)(idata.sel)->sel_vector[uVar3];
        }
        if (idata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar7 = false;
        }
        else {
          bVar7 = (idata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar3 >> 6] >> (uVar3 & 0x3f) & 1) == 0;
        }
        value.value.inlined.inlined[4] = bVar7;
        value.value._0_8_ = *(undefined8 *)pdVar6;
        value.value._9_7_ = 0;
        FirstFunctionStringBase<false,false>::SetValue<duckdb::FirstState<duckdb::string_t>,false>
                  (*(FirstFunctionStringBase<false,false> **)(sdata.data + uVar4 * 8),
                   (FirstState<duckdb::string_t> *)inputs,*(AggregateInputData **)(pdVar6 + -8),
                   value,(bool)is_null);
      }
      pdVar6 = pdVar6 + 0x10;
    }
    Vector::~Vector(&sort_key);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&sdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&idata);
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &input_data, idx_t, Vector &state_vector, idx_t count) {
		auto &input = inputs[0];
		UnifiedVectorFormat idata;
		input.ToUnifiedFormat(count, idata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto idx = idata.sel->get_index(i);
			bool is_null = !idata.validity.RowIsValid(idx);
			if (SKIP_NULLS && is_null) {
				continue;
			}
			auto &state = *states[sdata.sel->get_index(i)];
			if (!LAST && state.is_set) {
				continue;
			}
			assign_sel[assign_count++] = NumericCast<sel_t>(i);
		}
		if (assign_count == 0) {
			// fast path - nothing to set
			return;
		}

		Vector sort_key(LogicalType::BLOB);
		OrderModifiers modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		if (assign_count == count) {
			CreateSortKeyHelpers::CreateSortKey(input, count, modifiers, sort_key);
		} else {
			SelectionVector sel(assign_sel);
			Vector sliced_input(input, sel, assign_count);
			CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		}
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto state_idx = sdata.sel->get_index(assign_sel[i]);
			auto &state = *states[state_idx];
			if (!LAST && state.is_set) {
				continue;
			}

			const auto idx = idata.sel->get_index(assign_sel[i]);
			bool is_null = !idata.validity.RowIsValid(idx);
			FirstFunctionStringBase<LAST, SKIP_NULLS>::template SetValue<STATE>(state, input_data, sort_key_data[i],
			                                                                    is_null);
		}
	}